

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteModelIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int b;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  word wVar12;
  int local_411c;
  int local_4110;
  int local_4100;
  int local_40fc;
  int k;
  int i_1;
  int nWordsMax;
  int nVarsMax;
  char *pSop;
  char pLut2 [32];
  char pLut1 [32];
  char pLut0 [32];
  word local_4080;
  word Func2;
  word Func1;
  word Func0;
  word pRes [1024];
  word pCube [1024];
  int Length;
  int nLutRoot;
  int nLutLeaf2;
  int nLutLeaf;
  int i;
  int nLeaves;
  Abc_Obj_t *pNet;
  char *pStr_local;
  Vec_Int_t *vCover_local;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  uVar2 = Abc_ObjFaninNum(pNode);
  fprintf((FILE *)pFile,"\n");
  uVar3 = Abc_ObjId(pNode);
  fprintf((FILE *)pFile,".model m%d\n",(ulong)uVar3);
  fprintf((FILE *)pFile,".inputs");
  for (nLutLeaf2 = 0; iVar4 = Abc_ObjFaninNum(pNode), nLutLeaf2 < iVar4; nLutLeaf2 = nLutLeaf2 + 1)
  {
    fprintf((FILE *)pFile," %c",(ulong)(nLutLeaf2 + 0x61));
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".outputs o\n");
  sVar7 = strlen(pStr);
  iVar4 = (int)sVar7;
  if ((iVar4 == 2) || (iVar4 == 3)) {
    for (nLutLeaf2 = 0; nLutLeaf2 < iVar4; nLutLeaf2 = nLutLeaf2 + 1) {
      if ((pStr[nLutLeaf2] + -0x30 < 3) || (6 < pStr[nLutLeaf2] + -0x30)) {
        printf("The LUT size (%d) should belong to {3,4,5,6}.\n",
               (ulong)((int)pStr[nLutLeaf2] - 0x30));
        return;
      }
    }
    iVar5 = *pStr + -0x30;
    if (iVar4 == 3) {
      local_4110 = pStr[1] + -0x30;
    }
    else {
      local_4110 = 0;
    }
    b = pStr[iVar4 + -1] + -0x30;
    if (local_4110 == 0) {
      local_411c = 0;
    }
    else {
      local_411c = local_4110 + -1;
    }
    if (*pStr + -0x31 + local_411c + b < (int)uVar2) {
      printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)uVar2,pStr);
    }
    else {
      iVar6 = Abc_MaxInt(iVar5,b);
      iVar6 = Abc_MaxInt(local_4110,iVar6);
      if (iVar6 < (int)uVar2) {
        memset(&pSop,0,0x20);
        if (Io_NtkWriteModelIntStruct::TruthStore[0][0] == 0) {
          for (local_40fc = 0; local_40fc < 0x10; local_40fc = local_40fc + 1) {
            Io_NtkWriteModelIntStruct::pTruths[local_40fc] =
                 Io_NtkWriteModelIntStruct::TruthStore[local_40fc];
          }
          for (local_40fc = 0; local_40fc < 6; local_40fc = local_40fc + 1) {
            for (local_4100 = 0; local_4100 < 0x400; local_4100 = local_4100 + 1) {
              Io_NtkWriteModelIntStruct::pTruths[local_40fc][local_4100] =
                   Io_NtkWriteModelIntStruct::Truth6[local_40fc];
            }
          }
          for (local_40fc = 6; local_40fc < 0x10; local_40fc = local_40fc + 1) {
            for (local_4100 = 0; local_4100 < 0x400; local_4100 = local_4100 + 1) {
              bVar1 = (char)local_40fc - 6U & 0x1f;
              wVar12 = (word)(uint)(0 >> bVar1);
              if ((local_4100 >> bVar1 & 1U) != 0) {
                wVar12 = 0xffffffffffffffff;
              }
              Io_NtkWriteModelIntStruct::pTruths[local_40fc][local_4100] = wVar12;
            }
          }
        }
        pcVar9 = (char *)Abc_ObjData(pNode);
        Abc_SopToTruthBig(pcVar9,uVar2,Io_NtkWriteModelIntStruct::pTruths,pRes + 0x3ff,&Func0);
        iVar6 = Kit_TruthIsConst0((uint *)&Func0,uVar2);
        if ((iVar6 == 0) && (iVar6 = Kit_TruthIsConst1((uint *)&Func0,uVar2), iVar6 == 0)) {
          if (iVar4 == 2) {
            iVar5 = If_CluCheckExt((void *)0x0,&Func0,uVar2,iVar5,b,pLut1 + 0x18,pLut2 + 0x18,&Func1
                                   ,&Func2);
            if (iVar5 == 0) {
              Extra_PrintHex(_stdout,(uint *)&Func0,uVar2);
              printf("    ");
              Kit_DsdPrintFromTruth((uint *)&Func0,uVar2);
              printf("\n");
              pAVar10 = Abc_ObjFanout0(pNode);
              pcVar9 = Abc_ObjName(pAVar10);
              printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar9);
              return;
            }
          }
          else {
            iVar5 = If_CluCheckExt3((void *)0x0,&Func0,uVar2,iVar5,local_4110,b,pLut1 + 0x18,
                                    pLut2 + 0x18,(char *)&pSop,&Func1,&Func2,&local_4080);
            if (iVar5 == 0) {
              Extra_PrintHex(_stdout,(uint *)&Func0,uVar2);
              printf("    ");
              Kit_DsdPrintFromTruth((uint *)&Func0,uVar2);
              printf("\n");
              pAVar10 = Abc_ObjFanout0(pNode);
              pcVar9 = Abc_ObjName(pAVar10);
              printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar9);
              return;
            }
          }
          fprintf((FILE *)pFile,".names");
          for (nLutLeaf2 = 0; nLutLeaf2 < pLut2[0x18]; nLutLeaf2 = nLutLeaf2 + 1) {
            fprintf((FILE *)pFile," %c",(ulong)((int)pLut2[(long)(nLutLeaf2 + 2) + 0x18] + 0x61));
          }
          fprintf((FILE *)pFile," lut1\n");
          pAVar11 = Abc_ObjNtk(pNode);
          pcVar9 = Io_NtkDeriveSop((Mem_Flex_t *)pAVar11->pManFunc,Func2,(int)pLut2[0x18],vCover);
          fprintf((FILE *)pFile,"%s",pcVar9);
          if ((iVar4 == 3) && ('\0' < (char)pSop)) {
            fprintf((FILE *)pFile,".names");
            for (nLutLeaf2 = 0; nLutLeaf2 < (char)pSop; nLutLeaf2 = nLutLeaf2 + 1) {
              if ((int)pLut2[(long)(nLutLeaf2 + 2) + -8] == uVar2) {
                fprintf((FILE *)pFile," lut1");
              }
              else {
                fprintf((FILE *)pFile," %c",(ulong)((int)pLut2[(long)(nLutLeaf2 + 2) + -8] + 0x61));
              }
            }
            fprintf((FILE *)pFile," lut2\n");
            pAVar11 = Abc_ObjNtk(pNode);
            pcVar9 = Io_NtkDeriveSop((Mem_Flex_t *)pAVar11->pManFunc,local_4080,(int)(char)pSop,
                                     vCover);
            fprintf((FILE *)pFile,"%s",pcVar9);
          }
          fprintf((FILE *)pFile,".names");
          for (nLutLeaf2 = 0; nLutLeaf2 < pLut1[0x18]; nLutLeaf2 = nLutLeaf2 + 1) {
            if ((int)pLut1[(long)(nLutLeaf2 + 2) + 0x18] == uVar2) {
              fprintf((FILE *)pFile," lut1");
            }
            else if ((int)pLut1[(long)(nLutLeaf2 + 2) + 0x18] == uVar2 + 1) {
              fprintf((FILE *)pFile," lut2");
            }
            else {
              fprintf((FILE *)pFile," %c",(ulong)((int)pLut1[(long)(nLutLeaf2 + 2) + 0x18] + 0x61));
            }
          }
          fprintf((FILE *)pFile," %s\n","o");
          pAVar11 = Abc_ObjNtk(pNode);
          pcVar9 = Io_NtkDeriveSop((Mem_Flex_t *)pAVar11->pManFunc,Func1,(int)pLut1[0x18],vCover);
          fprintf((FILE *)pFile,"%s",pcVar9);
          fprintf((FILE *)pFile,".end\n");
        }
        else {
          uVar2 = Kit_TruthIsConst1((uint *)&Func0,uVar2);
          fprintf((FILE *)pFile,".names %s\n %d\n","o",(ulong)uVar2);
          fprintf((FILE *)pFile,".end\n");
        }
      }
      else {
        fprintf((FILE *)pFile,".names");
        for (nLutLeaf2 = 0; iVar4 = Abc_ObjFaninNum(pNode), nLutLeaf2 < iVar4;
            nLutLeaf2 = nLutLeaf2 + 1) {
          Abc_ObjFanin(pNode,nLutLeaf2);
          fprintf((FILE *)pFile," %c",(ulong)(nLutLeaf2 + 0x61));
        }
        fprintf((FILE *)pFile," %s\n","o");
        pvVar8 = Abc_ObjData(pNode);
        fprintf((FILE *)pFile,"%s",pvVar8);
        fprintf((FILE *)pFile,".end\n");
      }
    }
  }
  else {
    printf("Wrong LUT struct (%s)\n",pStr);
  }
  return;
}

Assistant:

void Io_NtkWriteModelIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // write the header
    fprintf( pFile, "\n" );
    fprintf( pFile, ".model m%d\n", Abc_ObjId(pNode) );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        fprintf( pFile, " %c", 'a' + i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %c", 'a' + i );
        // get the output name
        fprintf( pFile, " %s\n", "o" );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        fprintf( pFile, ".end\n" );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", "o", Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            fprintf( pFile, ".end\n" );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %c", 'a' + pLut1[2+i] );
        fprintf( pFile, " lut1\n" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " lut1" );
                else
                    fprintf( pFile, " %c", 'a' + pLut2[2+i] );
            fprintf( pFile, " lut2\n" );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " lut1" );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " lut2" );
            else
                fprintf( pFile, " %c", 'a' + pLut0[2+i] );
        fprintf( pFile, " %s\n", "o" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
        fprintf( pFile, ".end\n" );
    }
}